

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Connection::readClientPreface(QHttp2Connection *this)

{
  int iVar1;
  QIODevice *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  qint64 read;
  QIODevice *socket;
  char buffer [24];
  bool local_29;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = getSocket((QHttp2Connection *)0x2b6525);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  lVar3 = QIODevice::read((char *)pQVar2,(longlong)&local_28);
  if (lVar3 == 0x18) {
    iVar1 = memcmp(&local_28,Http2::Http2clientPreface,0x18);
    local_29 = iVar1 == 0;
  }
  else {
    local_29 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::readClientPreface()
{
    auto *socket = getSocket();
    Q_ASSERT(socket->bytesAvailable() >= Http2::clientPrefaceLength);
    char buffer[Http2::clientPrefaceLength];
    const qint64 read = socket->read(buffer, Http2::clientPrefaceLength);
    if (read != Http2::clientPrefaceLength)
        return false;
    return memcmp(buffer, Http2::Http2clientPreface, Http2::clientPrefaceLength) == 0;
}